

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O0

void pdqsort_detail::
     pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsPrimalHeuristics::setupIntCols()::__0,false>
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,
               anon_class_8_1_8991fb9c comp,int bad_allowed,bool leftmost)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __a;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __a_00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __a_01;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __a_02;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __a_03;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __a_04;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __a_05;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __a_06;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __a_07;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __a_08;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __a_09;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __a_10;
  anon_class_8_1_8991fb9c __comp;
  anon_class_8_1_8991fb9c __comp_00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last_00;
  anon_class_8_1_8991fb9c comp_00;
  bool bVar1;
  bool bVar2;
  difference_type dVar3;
  reference piVar4;
  difference_type dVar5;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *p_Var6;
  int in_ECX;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_RDX;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_RSI;
  HighsPrimalHeuristics *in_RDI;
  undefined1 in_R8B;
  pair<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_bool> pVar7;
  bool highly_unbalanced;
  diff_t r_size;
  diff_t l_size;
  bool already_partitioned;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> pivot_pos;
  pair<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_bool>
  part_result;
  diff_t s2;
  diff_t size;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffcc8;
  uint7 in_stack_fffffffffffffcd0;
  undefined1 in_stack_fffffffffffffcd7;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *in_stack_fffffffffffffcd8;
  undefined7 in_stack_fffffffffffffce0;
  undefined1 uVar8;
  int in_stack_fffffffffffffce8;
  uint in_stack_fffffffffffffcec;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffcf0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffd00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffd08;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffd10;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffd18;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffd20;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffd28;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffd30;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffd38;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffd40;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffda0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffda8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_118 [2];
  int *local_108;
  HighsPrimalHeuristics *local_100;
  int *local_f8;
  int *local_f0;
  HighsPrimalHeuristics *local_e8;
  int *local_d8;
  int *local_d0;
  int *local_c8;
  int *local_b8;
  int *local_b0;
  int *local_a8;
  int *local_98;
  int *local_90;
  int *local_88;
  int *local_78;
  int *local_70;
  HighsPrimalHeuristics *local_68;
  long local_60;
  HighsPrimalHeuristics *local_48;
  HighsPrimalHeuristics *local_30;
  undefined3 in_stack_ffffffffffffffe0;
  uint uVar9;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var10;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_8;
  
  uVar9 = CONCAT13(in_R8B,in_stack_ffffffffffffffe0) & 0x1ffffff;
  local_8._M_current = (int *)in_RDI;
  do {
    while( true ) {
      dVar3 = __gnu_cxx::operator-
                        ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_fffffffffffffcc8._M_current);
      if (dVar3 < 0x18) {
        if ((uVar9 & 0x1000000) == 0) {
          local_48 = (HighsPrimalHeuristics *)local_8._M_current;
          unguarded_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsPrimalHeuristics::setupIntCols()::__0>
                    (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,
                     (anon_class_8_1_8991fb9c)in_stack_fffffffffffffd00._M_current);
        }
        else {
          local_30 = (HighsPrimalHeuristics *)local_8._M_current;
          insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsPrimalHeuristics::setupIntCols()::__0>
                    (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,
                     (anon_class_8_1_8991fb9c)in_stack_fffffffffffffd00._M_current);
        }
        return;
      }
      local_60 = dVar3 / 2;
      if (dVar3 < 0x81) {
        local_f8 = (int *)__gnu_cxx::
                          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                          operator+(in_stack_fffffffffffffcd8,
                                    CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
        local_100 = (HighsPrimalHeuristics *)local_8._M_current;
        local_108 = (int *)__gnu_cxx::
                           __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                           operator-(in_stack_fffffffffffffcd8,
                                     CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
        sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsPrimalHeuristics::setupIntCols()::__0>
                  (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                   (anon_class_8_1_8991fb9c)in_stack_fffffffffffffd08._M_current);
      }
      else {
        local_68 = (HighsPrimalHeuristics *)local_8._M_current;
        local_70 = (int *)__gnu_cxx::
                          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                          operator+(in_stack_fffffffffffffcd8,
                                    CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
        local_78 = (int *)__gnu_cxx::
                          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                          operator-(in_stack_fffffffffffffcd8,
                                    CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
        sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsPrimalHeuristics::setupIntCols()::__0>
                  (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                   (anon_class_8_1_8991fb9c)in_stack_fffffffffffffd08._M_current);
        local_88 = (int *)__gnu_cxx::
                          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                          operator+(in_stack_fffffffffffffcd8,
                                    CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
        local_90 = (int *)__gnu_cxx::
                          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                          operator+(in_stack_fffffffffffffcd8,
                                    CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
        local_98 = (int *)__gnu_cxx::
                          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                          operator-(in_stack_fffffffffffffcd8,
                                    CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
        sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsPrimalHeuristics::setupIntCols()::__0>
                  (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                   (anon_class_8_1_8991fb9c)in_stack_fffffffffffffd08._M_current);
        local_a8 = (int *)__gnu_cxx::
                          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                          operator+(in_stack_fffffffffffffcd8,
                                    CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
        local_b0 = (int *)__gnu_cxx::
                          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                          operator+(in_stack_fffffffffffffcd8,
                                    CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
        local_b8 = (int *)__gnu_cxx::
                          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                          operator-(in_stack_fffffffffffffcd8,
                                    CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
        sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsPrimalHeuristics::setupIntCols()::__0>
                  (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                   (anon_class_8_1_8991fb9c)in_stack_fffffffffffffd08._M_current);
        local_c8 = (int *)__gnu_cxx::
                          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                          operator+(in_stack_fffffffffffffcd8,
                                    CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
        local_d0 = (int *)__gnu_cxx::
                          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                          operator+(in_stack_fffffffffffffcd8,
                                    CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
        local_d8 = (int *)__gnu_cxx::
                          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                          operator+(in_stack_fffffffffffffcd8,
                                    CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
        sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsPrimalHeuristics::setupIntCols()::__0>
                  (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                   (anon_class_8_1_8991fb9c)in_stack_fffffffffffffd08._M_current);
        local_e8 = (HighsPrimalHeuristics *)local_8._M_current;
        local_f0 = (int *)__gnu_cxx::
                          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                          operator+(in_stack_fffffffffffffcd8,
                                    CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
        _Var10._M_current._7_1_ = in_stack_fffffffffffffcd7;
        _Var10._M_current._0_7_ = in_stack_fffffffffffffcd0;
        std::
        iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                  (_Var10,in_stack_fffffffffffffcc8);
      }
      in_stack_fffffffffffffcec = in_stack_fffffffffffffcec & 0xffffff;
      if ((uVar9 & 0x1000000) == 0) {
        local_118[0] = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                       ::operator-(in_stack_fffffffffffffcd8,
                                   CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
        piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(local_118);
        in_stack_fffffffffffffce8 = *piVar4;
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                  (&local_8);
        bVar1 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                          ((anon_class_8_1_8991fb9c *)in_stack_fffffffffffffda8._M_current,
                           (HighsInt)((ulong)in_stack_fffffffffffffda0._M_current >> 0x20),
                           (HighsInt)in_stack_fffffffffffffda0._M_current);
        in_stack_fffffffffffffcec = CONCAT13(bVar1,(int3)in_stack_fffffffffffffcec) ^ 0xff000000;
      }
      if ((in_stack_fffffffffffffcec & 0x1000000) == 0) break;
      partition_left<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsPrimalHeuristics::setupIntCols()::__0>
                (in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,
                 (anon_class_8_1_8991fb9c)in_stack_fffffffffffffd18._M_current);
      local_8 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator+(in_stack_fffffffffffffcd8,
                          CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
    }
    pVar7 = partition_right<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsPrimalHeuristics::setupIntCols()::__0>
                      (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                       (anon_class_8_1_8991fb9c)in_stack_fffffffffffffd30._M_current);
    in_stack_fffffffffffffd00 = pVar7.first._M_current;
    dVar5 = __gnu_cxx::operator-
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_fffffffffffffcc8._M_current);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
              (in_stack_fffffffffffffcd8,
               CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
    p_Var6 = (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
             __gnu_cxx::operator-
                       ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                        CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
                        (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                        in_stack_fffffffffffffcc8._M_current);
    bVar1 = dVar3 / 8 <= dVar5;
    if (bVar1) {
      in_stack_fffffffffffffcd8 = p_Var6;
    }
    bVar1 = !bVar1;
    bVar2 = (long)p_Var6 < dVar3 / 8;
    uVar8 = bVar1 || bVar2;
    if (bVar1 || bVar2) {
      in_ECX = in_ECX + -1;
      if (in_ECX == 0) {
        __last._M_current._4_4_ = in_stack_fffffffffffffcec;
        __last._M_current._0_4_ = in_stack_fffffffffffffce8;
        __comp.this._7_1_ = (bool)uVar8;
        __comp.this._0_7_ = in_stack_fffffffffffffce0;
        std::
        make_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsPrimalHeuristics::setupIntCols()::__0>
                  (in_stack_fffffffffffffcf0,__last,__comp);
        __last_00._M_current._4_4_ = in_stack_fffffffffffffcec;
        __last_00._M_current._0_4_ = in_stack_fffffffffffffce8;
        __comp_00.this._7_1_ = uVar8;
        __comp_00.this._0_7_ = in_stack_fffffffffffffce0;
        std::
        sort_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsPrimalHeuristics::setupIntCols()::__0>
                  (in_stack_fffffffffffffcf0,__last_00,__comp_00);
        return;
      }
      if (0x17 < dVar5) {
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                  (in_stack_fffffffffffffcd8,
                   CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
        __a._M_current._7_1_ = in_stack_fffffffffffffcd7;
        __a._M_current._0_7_ = in_stack_fffffffffffffcd0;
        std::
        iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                  (__a,in_stack_fffffffffffffcc8);
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator-
                  (in_stack_fffffffffffffcd8,
                   CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator-
                  (in_stack_fffffffffffffcd8,
                   CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
        __a_00._M_current._7_1_ = in_stack_fffffffffffffcd7;
        __a_00._M_current._0_7_ = in_stack_fffffffffffffcd0;
        std::
        iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                  (__a_00,in_stack_fffffffffffffcc8);
        if (0x80 < dVar5) {
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                    (in_stack_fffffffffffffcd8,
                     CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                    (in_stack_fffffffffffffcd8,
                     CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
          __a_01._M_current._7_1_ = in_stack_fffffffffffffcd7;
          __a_01._M_current._0_7_ = in_stack_fffffffffffffcd0;
          std::
          iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                    (__a_01,in_stack_fffffffffffffcc8);
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                    (in_stack_fffffffffffffcd8,
                     CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                    (in_stack_fffffffffffffcd8,
                     CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
          __a_02._M_current._7_1_ = in_stack_fffffffffffffcd7;
          __a_02._M_current._0_7_ = in_stack_fffffffffffffcd0;
          std::
          iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                    (__a_02,in_stack_fffffffffffffcc8);
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator-
                    (in_stack_fffffffffffffcd8,
                     CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator-
                    (in_stack_fffffffffffffcd8,
                     CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
          __a_03._M_current._7_1_ = in_stack_fffffffffffffcd7;
          __a_03._M_current._0_7_ = in_stack_fffffffffffffcd0;
          std::
          iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                    (__a_03,in_stack_fffffffffffffcc8);
          in_stack_fffffffffffffda8 =
               __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator-(in_stack_fffffffffffffcd8,
                         CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
          in_stack_fffffffffffffda0 =
               __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator-(in_stack_fffffffffffffcd8,
                         CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
          __a_04._M_current._7_1_ = in_stack_fffffffffffffcd7;
          __a_04._M_current._0_7_ = in_stack_fffffffffffffcd0;
          std::
          iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                    (__a_04,in_stack_fffffffffffffcc8);
        }
      }
      if (0x17 < (long)p_Var6) {
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                  (in_stack_fffffffffffffcd8,
                   CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                  (in_stack_fffffffffffffcd8,
                   CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
        __a_05._M_current._7_1_ = in_stack_fffffffffffffcd7;
        __a_05._M_current._0_7_ = in_stack_fffffffffffffcd0;
        std::
        iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                  (__a_05,in_stack_fffffffffffffcc8);
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator-
                  (in_stack_fffffffffffffcd8,
                   CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator-
                  (in_stack_fffffffffffffcd8,
                   CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
        __a_06._M_current._7_1_ = in_stack_fffffffffffffcd7;
        __a_06._M_current._0_7_ = in_stack_fffffffffffffcd0;
        std::
        iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                  (__a_06,in_stack_fffffffffffffcc8);
        if (0x80 < (long)p_Var6) {
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                    (in_stack_fffffffffffffcd8,
                     CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                    (in_stack_fffffffffffffcd8,
                     CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
          __a_07._M_current._7_1_ = in_stack_fffffffffffffcd7;
          __a_07._M_current._0_7_ = in_stack_fffffffffffffcd0;
          std::
          iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                    (__a_07,in_stack_fffffffffffffcc8);
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                    (in_stack_fffffffffffffcd8,
                     CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                    (in_stack_fffffffffffffcd8,
                     CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
          __a_08._M_current._7_1_ = in_stack_fffffffffffffcd7;
          __a_08._M_current._0_7_ = in_stack_fffffffffffffcd0;
          std::
          iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                    (__a_08,in_stack_fffffffffffffcc8);
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator-
                    (in_stack_fffffffffffffcd8,
                     CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator-
                    (in_stack_fffffffffffffcd8,
                     CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
          __a_09._M_current._7_1_ = in_stack_fffffffffffffcd7;
          __a_09._M_current._0_7_ = in_stack_fffffffffffffcd0;
          std::
          iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                    (__a_09,in_stack_fffffffffffffcc8);
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator-
                    (in_stack_fffffffffffffcd8,
                     CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
          in_stack_fffffffffffffd40 =
               __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator-(in_stack_fffffffffffffcd8,
                         CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
          __a_10._M_current._7_1_ = in_stack_fffffffffffffcd7;
          __a_10._M_current._0_7_ = in_stack_fffffffffffffcd0;
          std::
          iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                    (__a_10,in_stack_fffffffffffffcc8);
        }
      }
    }
    else {
      bVar1 = false;
      _Var10._M_current = in_RDX._M_current;
      if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        in_stack_fffffffffffffd30._M_current = in_stack_fffffffffffffd00._M_current;
        in_stack_fffffffffffffd38._M_current = local_8._M_current;
        bVar2 = partial_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsPrimalHeuristics::setupIntCols()::__0>
                          (in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                           (anon_class_8_1_8991fb9c)in_stack_fffffffffffffd08._M_current);
        bVar1 = false;
        in_stack_fffffffffffffd28._M_current = in_RDX._M_current;
        if (bVar2) {
          in_stack_fffffffffffffd10._M_current = _Var10._M_current;
          in_stack_fffffffffffffd18._M_current = in_RSI._M_current;
          in_stack_fffffffffffffd20 =
               __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator+(in_stack_fffffffffffffcd8,(ulong)in_stack_fffffffffffffcd0);
          _Var10._M_current = in_stack_fffffffffffffd10._M_current;
          in_RSI._M_current = in_stack_fffffffffffffd18._M_current;
          bVar1 = partial_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsPrimalHeuristics::setupIntCols()::__0>
                            (in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                             (anon_class_8_1_8991fb9c)in_stack_fffffffffffffd08._M_current);
          in_stack_fffffffffffffd28._M_current = in_RDX._M_current;
        }
      }
      in_RDX._M_current = _Var10._M_current;
      if (bVar1 != false) {
        return;
      }
      in_stack_fffffffffffffcd7 = 0;
    }
    comp_00.this._4_4_ = in_ECX;
    comp_00.this._0_4_ = uVar9;
    in_stack_fffffffffffffd08._M_current = local_8._M_current;
    pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsPrimalHeuristics::setupIntCols()::__0,false>
              (in_RSI,in_RDX,comp_00,(int)((ulong)dVar3 >> 0x20),SUB81((ulong)dVar3 >> 0x18,0));
    in_stack_fffffffffffffcf0 =
         __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                   (in_stack_fffffffffffffcd8,
                    CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
    uVar9 = uVar9 & 0xffffff;
    local_8 = in_stack_fffffffffffffcf0;
  } while( true );
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }